

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::PeelDiagonal(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  PeelRow *pPVar8;
  uint64_t *puVar9;
  uint64_t *puVar10;
  uint uVar11;
  uint16_t *puVar12;
  uint8_t *__dest;
  uint uVar13;
  ulong uVar14;
  uint j;
  ulong uVar15;
  uint uVar16;
  PeelRefs *pPVar17;
  uint uVar18;
  ulong uVar19;
  uint i;
  long lVar20;
  uint8_t *vz;
  ushort auStack_4e [3];
  PeelRow *local_48;
  PeelRefs *local_40;
  ulong local_38;
  
  puVar12 = &this->_peel_head_rows;
  while( true ) {
    uVar1 = *puVar12;
    uVar19 = (ulong)uVar1;
    if (uVar1 == 0xffff) break;
    pPVar8 = this->_peel_rows;
    puVar9 = this->_compress_matrix;
    uVar2 = this->_mix_count;
    uVar3 = this->_mix_next_prime;
    local_48 = pPVar8 + uVar19;
    uVar4 = pPVar8[uVar19].Params.MixFirst;
    uVar13 = (uint)uVar4;
    uVar5 = pPVar8[uVar19].Marks.Unmarked[0];
    uVar6 = pPVar8[uVar19].Params.MixAdd;
    uVar11 = (uint)uVar6;
    uVar16 = this->_ge_pitch * (uint)uVar1;
    uVar7 = this->_defer_count;
    for (lVar20 = 1; lVar20 != 3; lVar20 = lVar20 + 1) {
      uVar13 = ((uVar13 & 0xffff) + (uint)uVar6) % (uint)uVar3;
      if (uVar2 <= uVar13) {
        uVar13 = uVar3 - uVar13;
        uVar18 = uVar13 & 0xffff;
        if (uVar6 < (ushort)uVar13) {
          uVar13 = (uVar11 * 0x10000 - uVar18) % uVar11;
        }
        else {
          uVar13 = uVar11 - uVar18;
        }
      }
      auStack_4e[lVar20] = (ushort)uVar13;
    }
    uVar13 = (uint)uVar4 + (uint)uVar7;
    puVar9[(ulong)uVar16 + (ulong)(uVar13 >> 6)] =
         puVar9[(ulong)uVar16 + (ulong)(uVar13 >> 6)] ^ 1L << ((ulong)uVar13 & 0x3f);
    uVar13 = (uint)auStack_4e[1] + (uint)uVar7;
    puVar9[(ulong)uVar16 + (ulong)(uVar13 >> 6)] =
         puVar9[(ulong)uVar16 + (ulong)(uVar13 >> 6)] ^ 1L << ((ulong)uVar13 & 0x3f);
    puVar9[(ulong)uVar16 + (ulong)((uint)auStack_4e[2] + (uint)uVar7 >> 6)] =
         puVar9[(ulong)uVar16 + (ulong)((uint)auStack_4e[2] + (uint)uVar7 >> 6)] ^
         1L << ((ulong)((uint)auStack_4e[2] + (uint)uVar7) & 0x3f);
    uVar13 = this->_block_bytes;
    uVar11 = (uint)uVar5;
    __dest = this->_recovery_blocks + uVar13 * uVar11;
    if ((local_48->Marks).Result.IsCopied == '\0') {
      if (this->_block_count - 1 == (uint)uVar1) {
        memcpy(__dest,this->_input_blocks + uVar13 * uVar1,(ulong)this->_input_final_bytes);
        memset(__dest + this->_input_final_bytes,0,
               (ulong)(this->_block_bytes - this->_input_final_bytes));
      }
      else {
        memcpy(__dest,this->_input_blocks + uVar13 * uVar1,(ulong)uVar13);
      }
    }
    uVar1 = this->_peel_col_refs[uVar11].RowCount;
    pPVar17 = this->_peel_col_refs + uVar11;
    local_40 = pPVar17;
    local_38 = uVar19;
    for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
      if (pPVar17->Rows[uVar14] != (ushort)uVar19) {
        uVar13 = this->_ge_pitch;
        uVar11 = (uint)pPVar17->Rows[uVar14];
        puVar10 = this->_compress_matrix;
        for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
          puVar10[uVar13 * uVar11 + uVar15] =
               puVar10[uVar13 * uVar11 + uVar15] ^ puVar9[uVar16 + uVar15];
        }
        pPVar8 = this->_peel_rows;
        if (pPVar8[uVar11].Marks.Unmarked[0] != 0xffff) {
          uVar13 = this->_block_bytes;
          vz = this->_recovery_blocks + pPVar8[uVar11].Marks.Unmarked[0] * uVar13;
          if (pPVar8[uVar11].Marks.Result.IsCopied == '\0') {
            if (this->_block_count - 1 == uVar11) {
              gf256_addset_mem(vz,__dest,this->_input_blocks + uVar13 * uVar11,
                               this->_input_final_bytes);
              uVar13 = this->_input_final_bytes;
              memcpy(vz + uVar13,__dest + uVar13,(ulong)(this->_block_bytes - uVar13));
            }
            else {
              gf256_addset_mem(vz,__dest,this->_input_blocks + uVar13 * uVar11,uVar13);
            }
            pPVar8[uVar11].Marks.Result.IsCopied = '\x01';
            pPVar17 = local_40;
            uVar19 = local_38;
          }
          else {
            gf256_add_mem(vz,__dest,uVar13);
            pPVar17 = local_40;
            uVar19 = local_38;
          }
        }
      }
    }
    puVar12 = &local_48->NextRow;
  }
  return;
}

Assistant:

void Codec::PeelDiagonal()
{
    CAT_IF_DUMP(cout << endl << "---- PeelDiagonal ----" << endl << endl;)

    /*
        This function optimizes the block value generation by combining the first
        memcpy and memxor operations together into a three-way memxor if possible,
        using the is_copied row member.
    */

    CAT_IF_ROWOP(unsigned rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each peeled row in forward solution order:
    for (uint16_t peel_row_i = _peel_head_rows;
        peel_row_i != LIST_TERM;
        peel_row_i = row->NextRow)
    {
        row = &_peel_rows[peel_row_i];

        // Lookup peeling results
        const uint16_t peel_column_i = row->Marks.Result.PeelColumn;
        uint64_t *ge_row = _compress_matrix + _ge_pitch * peel_row_i;

        CAT_IF_DUMP(cout << "Peeled row " << peel_row_i << " for peeled column " << peel_column_i << " :";)

        const unsigned defer_count = _defer_count;
        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Generate mixing column 1
        const unsigned ge_column_i = defer_count + mix.Columns[0];
        ge_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
        CAT_IF_DUMP(cout << " " << ge_column_i;)

        // Generate mixing column 2
        const unsigned ge_column_j = defer_count + mix.Columns[1];
        ge_row[ge_column_j >> 6] ^= (uint64_t)1 << (ge_column_j & 63);
        CAT_IF_DUMP(cout << " " << ge_column_j;)

        // Generate mixing column 3
        const unsigned ge_column_k = defer_count + mix.Columns[2];
        ge_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        CAT_IF_DUMP(cout << " " << ge_column_k << endl;)

        // Get pointer to output block
        CAT_DEBUG_ASSERT(peel_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT temp_block_src = _recovery_blocks + _block_bytes * peel_column_i;

        // If row has not been copied yet:
        if (!row->Marks.Result.IsCopied)
        {
            const uint8_t * GF256_RESTRICT block_src = _input_blocks + _block_bytes * peel_row_i;

            // If this is not the last block:
            if (peel_row_i != _block_count - 1) {
                // Copy it directly to the output block
                memcpy(temp_block_src, block_src, _block_bytes);
            }
            else
            {
                // Copy with zero padding
                memcpy(temp_block_src, block_src, _input_final_bytes);
                CAT_DEBUG_ASSERT(_block_bytes >= _input_final_bytes);
                memset(temp_block_src + _input_final_bytes, 0, _block_bytes - _input_final_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            CAT_IF_DUMP(cout << "-- Copied from " << peel_row_i <<
                " because has not been copied yet.  Output block = " <<
                (unsigned)temp_block_src[0] << endl;)

            // Note that we do not need to set is_copied here because no
            // further rows reference this one
        }

        CAT_IF_DUMP(cout << "++ Adding to referencing rows:";)

        PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[peel_column_i];
        const uint16_t * GF256_RESTRICT referencingRows = refs->Rows;

        // For each row that references this one:
        for (unsigned i = 0, count = refs->RowCount; i < count; ++i)
        {
            const uint16_t ref_row_i = referencingRows[i];

            // If it references the current row:
            if (ref_row_i == peel_row_i) {
                // Skip this row
                continue;
            }

            CAT_IF_DUMP(cout << " " << ref_row_i;)

            uint64_t * GF256_RESTRICT ge_ref_row = _compress_matrix + _ge_pitch * ref_row_i;

            // Add GE row to referencing GE row
            for (unsigned j = 0; j < _ge_pitch; ++j) {
                ge_ref_row[j] ^= ge_row[j];
            }

            PeelRow * GF256_RESTRICT ref_row = &_peel_rows[ref_row_i];
            const uint16_t ref_column_i = ref_row->Marks.Result.PeelColumn;

            // If row is peeled:
            if (ref_column_i != LIST_TERM)
            {
                // Generate temporary row block value:
                CAT_DEBUG_ASSERT(ref_column_i < _recovery_rows);
                uint8_t * GF256_RESTRICT temp_block_dest = _recovery_blocks + _block_bytes * ref_column_i;

                // If referencing row is already copied to the recovery blocks:
                if (ref_row->Marks.Result.IsCopied) {
                    // Add this row block value to it
                    gf256_add_mem(temp_block_dest, temp_block_src, _block_bytes);
                }
                else
                {
                    const uint8_t * GF256_RESTRICT block_src = _input_blocks + _block_bytes * ref_row_i;

                    // If this is not the last block:
                    if (ref_row_i != _block_count - 1) {
                        // Add this row block value with message block to it (optimization)
                        gf256_addset_mem(temp_block_dest, temp_block_src, block_src, _block_bytes);
                    }
                    else
                    {
                        // Add with zero padding
                        gf256_addset_mem(temp_block_dest, temp_block_src, block_src, _input_final_bytes);

                        CAT_DEBUG_ASSERT(_block_bytes >= _input_final_bytes);
                        memcpy(
                            temp_block_dest + _input_final_bytes,
                            temp_block_src + _input_final_bytes,
                            _block_bytes - _input_final_bytes);
                    }

                    ref_row->Marks.Result.IsCopied = 1;
                }

                CAT_IF_ROWOP(++rowops;)
            } // end if referencing row is peeled

        } // next referencing row

        CAT_IF_DUMP(cout << endl;)

    } // next peeled row

    CAT_IF_ROWOP(cout << "PeelDiagonal used " << rowops << " row ops = "
        << rowops / (double)_block_count << "*N" << endl;)
}